

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O1

void try_hop(btbb_packet *pkt,btbb_piconet *pn)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = pn->UAP;
  btbb_decode(pkt,pn);
  uVar2 = pn->flags;
  if ((uVar2 >> 9 & 1) == 0) {
    iVar3 = btbb_uap_from_header(pkt,pn);
    if ((uVar2 & 0x10) == 0) {
      if (iVar3 != 0) {
        if (uVar1 == pn->UAP) {
          puts("got CLK1-6");
          btbb_init_hop_reversal(0,pn);
          btbb_winnow(pn);
        }
        else {
          puts("failed to confirm UAP");
        }
      }
      goto LAB_0010636d;
    }
  }
  else {
    pn->pattern_indices[pn->packets_observed] = pkt->clkn - pn->first_pkt_time;
    pn->pattern_channels[pn->packets_observed] = pkt->channel;
    pn->packets_observed = pn->packets_observed + 1;
    pn->total_packets_observed = pn->total_packets_observed + 1;
    btbb_winnow(pn);
  }
  if ((pn->flags & 0x20) != 0) {
    puts("got CLK1-27");
    printf("clock offset = %d.\n",(ulong)(uint)pn->clk_offset);
  }
LAB_0010636d:
  if ((pn->flags & 4) == 0) {
    pn->flags = pn->flags | 4;
    pn->UAP = uVar1;
  }
  return;
}

Assistant:

void try_hop(btbb_packet *pkt, btbb_piconet *pn)
{
	uint8_t filter_uap = pn->UAP;

	/* Decode packet - fixing clock drift in the process */
	btbb_decode(pkt, pn);

	if (btbb_piconet_get_flag(pn, BTBB_HOP_REVERSAL_INIT)) {
		//pn->winnowed = 0;
		pn->pattern_indices[pn->packets_observed] =
			pkt->clkn - pn->first_pkt_time;
		pn->pattern_channels[pn->packets_observed] = pkt->channel;
		pn->packets_observed++;
		pn->total_packets_observed++;
		btbb_winnow(pn);
		if (btbb_piconet_get_flag(pn, BTBB_CLK27_VALID)) {
			printf("got CLK1-27\n");
			printf("clock offset = %d.\n", pn->clk_offset);
		}
	} else {
		if (btbb_piconet_get_flag(pn, BTBB_CLK6_VALID)) {
			btbb_uap_from_header(pkt, pn);
			if (btbb_piconet_get_flag(pn, BTBB_CLK27_VALID)) {
				printf("got CLK1-27\n");
				printf("clock offset = %d.\n", pn->clk_offset);
			}
		} else {
			if (btbb_uap_from_header(pkt, pn)) {
				if (filter_uap == pn->UAP) {
					printf("got CLK1-6\n");
					btbb_init_hop_reversal(0, pn);
					btbb_winnow(pn);
				} else {
					printf("failed to confirm UAP\n");
				}
			}
		}
	}

	if(!btbb_piconet_get_flag(pn, BTBB_UAP_VALID)) {
		btbb_piconet_set_flag(pn, BTBB_UAP_VALID, 1);
		pn->UAP = filter_uap;
	}
}